

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O0

int mbedtls_cipher_cmac_finish(mbedtls_cipher_context_t *ctx,uchar *output)

{
  mbedtls_cmac_context_t *output_00;
  ulong block_size_00;
  size_t block_size;
  size_t olen;
  uchar local_68 [4];
  int ret;
  uchar M_last [16];
  uchar K2 [16];
  uchar K1 [16];
  uchar *last_block;
  uchar *state;
  mbedtls_cmac_context_t *cmac_ctx;
  uchar *output_local;
  mbedtls_cipher_context_t *ctx_local;
  
  olen._4_4_ = 0xffffff92;
  if ((((ctx == (mbedtls_cipher_context_t *)0x0) ||
       (ctx->cipher_info == (mbedtls_cipher_info_t *)0x0)) ||
      (ctx->cmac_ctx == (mbedtls_cmac_context_t *)0x0)) || (output == (uchar *)0x0)) {
    ctx_local._4_4_ = -0x6100;
  }
  else {
    output_00 = ctx->cmac_ctx;
    block_size_00 = (ulong)ctx->cipher_info->block_size;
    mbedtls_platform_zeroize(K2 + 8,0x10);
    mbedtls_platform_zeroize(M_last + 8,0x10);
    cmac_generate_subkeys(ctx,K2 + 8,M_last + 8);
    if (output_00->unprocessed_len < block_size_00) {
      cmac_pad(local_68,block_size_00,output_00->unprocessed_block,output_00->unprocessed_len);
      cmac_xor_block(local_68,local_68,M_last + 8,block_size_00);
    }
    else {
      cmac_xor_block(local_68,output_00->unprocessed_block,K2 + 8,block_size_00);
    }
    cmac_xor_block(output_00->state,local_68,output_00->state,block_size_00);
    olen._4_4_ = mbedtls_cipher_update
                           (ctx,output_00->state,block_size_00,output_00->state,&block_size);
    if (olen._4_4_ == 0) {
      memcpy(output,output_00,block_size_00);
    }
    mbedtls_platform_zeroize(K2 + 8,0x10);
    mbedtls_platform_zeroize(M_last + 8,0x10);
    output_00->unprocessed_len = 0;
    mbedtls_platform_zeroize(output_00->unprocessed_block,0x10);
    mbedtls_platform_zeroize(output_00,0x10);
    ctx_local._4_4_ = olen._4_4_;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_cipher_cmac_finish( mbedtls_cipher_context_t *ctx,
                                unsigned char *output )
{
    mbedtls_cmac_context_t* cmac_ctx;
    unsigned char *state, *last_block;
    unsigned char K1[MBEDTLS_CIPHER_BLKSIZE_MAX];
    unsigned char K2[MBEDTLS_CIPHER_BLKSIZE_MAX];
    unsigned char M_last[MBEDTLS_CIPHER_BLKSIZE_MAX];
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t olen, block_size;

    if( ctx == NULL || ctx->cipher_info == NULL || ctx->cmac_ctx == NULL ||
        output == NULL )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

    cmac_ctx = ctx->cmac_ctx;
    block_size = ctx->cipher_info->block_size;
    state = cmac_ctx->state;

    mbedtls_platform_zeroize( K1, sizeof( K1 ) );
    mbedtls_platform_zeroize( K2, sizeof( K2 ) );
    cmac_generate_subkeys( ctx, K1, K2 );

    last_block = cmac_ctx->unprocessed_block;

    /* Calculate last block */
    if( cmac_ctx->unprocessed_len < block_size )
    {
        cmac_pad( M_last, block_size, last_block, cmac_ctx->unprocessed_len );
        cmac_xor_block( M_last, M_last, K2, block_size );
    }
    else
    {
        /* Last block is complete block */
        cmac_xor_block( M_last, last_block, K1, block_size );
    }


    cmac_xor_block( state, M_last, state, block_size );
    if( ( ret = mbedtls_cipher_update( ctx, state, block_size, state,
                                       &olen ) ) != 0 )
    {
        goto exit;
    }

    memcpy( output, state, block_size );

exit:
    /* Wipe the generated keys on the stack, and any other transients to avoid
     * side channel leakage */
    mbedtls_platform_zeroize( K1, sizeof( K1 ) );
    mbedtls_platform_zeroize( K2, sizeof( K2 ) );

    cmac_ctx->unprocessed_len = 0;
    mbedtls_platform_zeroize( cmac_ctx->unprocessed_block,
                              sizeof( cmac_ctx->unprocessed_block ) );

    mbedtls_platform_zeroize( state, MBEDTLS_CIPHER_BLKSIZE_MAX );
    return( ret );
}